

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall TextReaderTest_ReadInt_Test::TestBody(TextReaderTest_ReadInt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  NLStringRef data;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  TextReader reader;
  AssertHelper local_b0;
  AssertionResult local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  long local_88 [2];
  TextReader<fmt::Locale> local_78;
  
  data.size_ = 0xb;
  data.data_ = "  11   -22 ";
  mp::internal::TextReader<fmt::Locale>::TextReader(&local_78,data,(CStringRef)0x27a539);
  local_a8._0_4_ = 0xb;
  local_b0.data_._0_4_ = mp::internal::TextReader<fmt::Locale>::ReadInt<int>(&local_78);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_98,"11","reader.ReadInt<int>()",(int *)&local_a8,(int *)&local_b0);
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b0.data_._0_4_ = 0xffffffea;
  local_a8._0_8_ = mp::internal::TextReader<fmt::Locale>::ReadInt<long>(&local_78);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_98,"-22","reader.ReadInt<long>()",(int *)&local_b0,(long *)&local_a8
            );
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_a8.success_ == true) {
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"test:1:12: expected integer","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadInt<int>(&local_78);
    }
    testing::AssertionResult::operator<<
              (&local_a8,
               (char (*) [104])
               "Expected: reader.ReadInt<int>() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88) {
      operator_delete(local_98.ptr_,local_88[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_98);
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x86,pcVar2);
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  if (((local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_98.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_98.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  freelocale((__locale_t)local_78.locale_.super_Locale.locale_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.super_ReaderBase.name_._M_dataplus._M_p !=
      &local_78.super_ReaderBase.name_.field_2) {
    operator_delete(local_78.super_ReaderBase.name_._M_dataplus._M_p,
                    local_78.super_ReaderBase.name_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TextReaderTest, ReadInt) {
  TextReader reader("  11   -22 ", "test");
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<long>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::ReadError,
                   "test:1:12: expected integer");
}